

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_vars.cc
# Opt level: O2

void tcmalloc::CentralCacheLockAll(void)

{
  SpinLock *pSVar1;
  undefined1 *this;
  int i;
  ulong uVar2;
  
  SpinLock::Lock((SpinLock *)(Static::pageheap_ + 8));
  this = Static::central_cache_;
  for (uVar2 = 0; uVar2 < DAT_00158b10; uVar2 = uVar2 + 1) {
    SpinLock::Lock((SpinLock *)this);
    this = (undefined1 *)((long)this + 0x4c0);
  }
  pSVar1 = ThreadCachePtr::GetSlowTLSLock();
  SpinLock::Lock(pSVar1);
  pSVar1 = GetSysAllocLock();
  SpinLock::Lock(pSVar1);
  return;
}

Assistant:

void CentralCacheLockAll() NO_THREAD_SAFETY_ANALYSIS
{
  Static::pageheap_lock()->Lock();
  for (int i = 0; i < Static::num_size_classes(); ++i)
    Static::central_cache()[i].Lock();
  ThreadCachePtr::GetSlowTLSLock()->Lock();
  GetSysAllocLock()->Lock();
}